

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

Path * Path::home(void)

{
  bool bVar1;
  char *ch;
  String *in_RDI;
  Path local_58;
  String local_38;
  undefined1 local_11;
  Path *ret;
  
  local_11 = 0;
  ch = getenv("HOME");
  String::String(&local_38,ch,0xffffffffffffffff);
  Path(&local_58);
  resolved((Path *)in_RDI,&local_38,RealPath,&local_58,(bool *)0x0);
  ~Path(&local_58);
  String::~String(&local_38);
  bVar1 = String::endsWith(in_RDI,'/',CaseSensitive);
  if (!bVar1) {
    String::append(in_RDI,'/');
  }
  return (Path *)in_RDI;
}

Assistant:

Path Path::home()
{
#ifdef _WIN32
    Path ret;

    // on windows, there is no definite "home" directory. If the HOME
    // environment variable is set, we use it. Otherwise, we use %USERPROFILE%,
    // which defaults to C:\User\<username>.
    // If %USERPROFILE% is not set, we use c:\.
    char *env;
    if((env = getenv("HOME")))
    {
        ret = env;
    }
    else if((env = getenv("USERPROFILE")))
    {
        ret = env;
    }
    else
    {
        ret = "c:/";
    }
#else
    Path ret = Path::resolved(getenv("HOME"));
#endif
    if (!ret.endsWith('/'))
        ret.append('/');
    return ret;
}